

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_select.c
# Opt level: O3

ssize_t tnt_select(tnt_stream *s,uint32_t space,uint32_t index,uint32_t limit,uint32_t offset,
                  uint8_t iterator,tnt_stream *key)

{
  ulong uVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  undefined1 *puVar8;
  char *pcVar9;
  undefined1 *puVar10;
  undefined7 in_register_00000089;
  long lVar11;
  char cVar12;
  char acStack_105 [21];
  undefined8 uStack_f0;
  undefined1 local_e8 [8];
  iovec v [4];
  char body [64];
  tnt_iheader hdr;
  char acStack_38 [3];
  char len_prefix [9];
  
  len_prefix._1_4_ = (undefined4)CONCAT71(in_register_00000089,iterator);
  uStack_f0 = 0x116380;
  iVar2 = tnt_object_verify(key,'\x05');
  sVar3 = -1;
  if (iVar2 == 0) {
    cVar12 = (char)len_prefix._1_4_;
    uVar1 = s->reqid;
    s->reqid = uVar1 + 1;
    body[0x39] = '\0';
    body[0x3d] = '\0';
    body[0x3e] = '\0';
    body[0x3f] = '\0';
    hdr.header[0] = '\0';
    hdr.header[1] = '\0';
    hdr.header[2] = '\0';
    hdr.header[3] = '\0';
    hdr.header[4] = '\0';
    hdr.header[5] = '\0';
    hdr.header[6] = '\0';
    hdr.header[7] = '\0';
    hdr.header[8] = '\0';
    hdr.header[9] = '\0';
    hdr.header[10] = '\0';
    hdr.header[0xb] = '\0';
    hdr.header[0xc] = '\0';
    hdr.header[0xd] = '\0';
    hdr.header[0xe] = '\0';
    hdr.header[0xf] = '\0';
    hdr.header[0x10] = '\0';
    hdr.header[0x11] = '\0';
    hdr.header[0x12] = '\0';
    hdr.header[0x13] = '\0';
    hdr.header[0x14] = '\0';
    hdr.header[0x15] = '\0';
    hdr.header[0x16] = '\0';
    hdr.header[0x17] = '\0';
    body[0x38] = -0x7e;
    body[0x3a] = '\x01';
    body[0x3b] = '\x01';
    cVar5 = (char)uVar1;
    if (uVar1 < 0x80) {
      lVar7 = 1;
      body[0x3c] = cVar5;
    }
    else if (uVar1 < 0x100) {
      body[0x3c] = -0x34;
      lVar7 = 2;
      body[0x3d] = cVar5;
    }
    else {
      body[0x3d] = (char)(uVar1 >> 8);
      if (uVar1 < 0x10000) {
        body[0x3c] = -0x33;
        lVar7 = 3;
        body[0x3e] = cVar5;
      }
      else if (uVar1 >> 0x20 == 0) {
        body[0x3c] = -0x32;
        body[0x3e] = (char)(uVar1 >> 0x10);
        body[0x3f] = body[0x3d];
        body[0x3d] = (char)(uVar1 >> 0x18);
        lVar7 = 5;
        hdr.header[0] = cVar5;
      }
      else {
        body[0x3c] = -0x31;
        body[0x3e] = (char)(uVar1 >> 0x30);
        body[0x3f] = (char)(uVar1 >> 0x28);
        hdr.header[0] = (char)(uVar1 >> 0x20);
        hdr.header._1_4_ =
             (uint)(uVar1 >> 0x18) & 0xff | (uint)(uVar1 >> 8) & 0xff00 |
             (uint)(((uVar1 & 0xff00) << 0x28) >> 0x20) | (uint)((uVar1 << 0x38) >> 0x20);
        body[0x3d] = (char)(uVar1 >> 0x38);
        lVar7 = 9;
      }
    }
    hdr._24_8_ = body + lVar7 + 0x3c;
    v[0].iov_len = (size_t)(body + 0x38);
    v[1].iov_base = (void *)(hdr._24_8_ + -v[0].iov_len);
    v[3].iov_len._0_2_ = 0x1086;
    if (space < 0x80) {
      lVar7 = 1;
      v[3].iov_len._2_1_ = (char)space;
    }
    else if (space < 0x100) {
      v[3].iov_len._2_1_ = 0xcc;
      v[3].iov_len._3_1_ = (char)space;
      lVar7 = 2;
    }
    else if (space < 0x10000) {
      v[3].iov_len._2_1_ = 0xcd;
      v[3].iov_len._3_2_ = (ushort)space << 8 | (ushort)space >> 8;
      lVar7 = 3;
    }
    else {
      v[3].iov_len._2_1_ = 0xce;
      v[3].iov_len._3_4_ =
           space >> 0x18 | (space & 0xff0000) >> 8 | (space & 0xff00) << 8 | space << 0x18;
      lVar7 = 5;
    }
    *(undefined1 *)((long)&v[3].iov_len + lVar7 + 2) = 0x11;
    puVar10 = (undefined1 *)((long)&v[3].iov_len + lVar7 + 3);
    if (index < 0x80) {
      *puVar10 = (char)index;
      lVar7 = 1;
    }
    else if (index < 0x100) {
      *(undefined1 *)((long)&v[3].iov_len + lVar7 + 3) = 0xcc;
      *(char *)((long)&v[3].iov_len + lVar7 + 4) = (char)index;
      lVar7 = 2;
    }
    else if (index < 0x10000) {
      *(undefined1 *)((long)&v[3].iov_len + lVar7 + 3) = 0xcd;
      *(ushort *)((long)&v[3].iov_len + lVar7 + 4) = (ushort)index << 8 | (ushort)index >> 8;
      lVar7 = 3;
    }
    else {
      *(undefined1 *)((long)&v[3].iov_len + lVar7 + 3) = 0xce;
      *(uint32_t *)((long)&v[3].iov_len + lVar7 + 4) =
           index >> 0x18 | (index & 0xff0000) >> 8 | (index & 0xff00) << 8 | index << 0x18;
      lVar7 = 5;
    }
    puVar8 = puVar10 + lVar7 + 1;
    puVar10[lVar7] = 0x12;
    if (limit < 0x80) {
      *puVar8 = (char)limit;
      lVar7 = 1;
    }
    else if (limit < 0x100) {
      puVar10[lVar7 + 1] = 0xcc;
      puVar10[lVar7 + 2] = (char)limit;
      lVar7 = 2;
    }
    else if (limit < 0x10000) {
      puVar10[lVar7 + 1] = 0xcd;
      *(ushort *)(puVar10 + lVar7 + 2) = (ushort)limit << 8 | (ushort)limit >> 8;
      lVar7 = 3;
    }
    else {
      puVar10[lVar7 + 1] = 0xce;
      *(uint32_t *)(puVar10 + lVar7 + 2) =
           limit >> 0x18 | (limit & 0xff0000) >> 8 | (limit & 0xff00) << 8 | limit << 0x18;
      lVar7 = 5;
    }
    puVar10 = puVar8 + lVar7 + 1;
    puVar8[lVar7] = 0x13;
    if (offset < 0x80) {
      *puVar10 = (char)offset;
      lVar7 = 1;
    }
    else if (offset < 0x100) {
      puVar8[lVar7 + 1] = 0xcc;
      puVar8[lVar7 + 2] = (char)offset;
      lVar7 = 2;
    }
    else if (offset < 0x10000) {
      puVar8[lVar7 + 1] = 0xcd;
      *(ushort *)(puVar8 + lVar7 + 2) = (ushort)offset << 8 | (ushort)offset >> 8;
      lVar7 = 3;
    }
    else {
      puVar8[lVar7 + 1] = 0xce;
      *(uint32_t *)(puVar8 + lVar7 + 2) =
           offset >> 0x18 | (offset & 0xff0000) >> 8 | (offset & 0xff00) << 8 | offset << 0x18;
      lVar7 = 5;
    }
    pcVar9 = puVar10 + lVar7 + 1;
    puVar10[lVar7] = 0x14;
    lVar11 = 1;
    if (cVar12 < '\0') {
      puVar10[lVar7 + 2] = cVar12;
      lVar11 = 2;
      cVar12 = -0x34;
    }
    *pcVar9 = cVar12;
    pcVar9[lVar11] = ' ';
    v[1].iov_len = (size_t)&v[3].iov_len;
    v[2].iov_base = pcVar9 + (lVar11 - v[1].iov_len) + 1;
    v[2].iov_len = *key->data;
    v[3].iov_base = *(void **)((long)key->data + 8);
    pcVar9 = (char *)((long)v[1].iov_base + (long)(pcVar9 + (lVar11 - v[1].iov_len) + 1)) +
             (long)v[3].iov_base;
    if ((ulong)pcVar9 >> 0x20 == 0) {
      pcVar4 = acStack_38;
      uVar6 = (uint)pcVar9;
      stack0xffffffffffffffc4 =
           CONCAT44(_acStack_38,
                    uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18)
      ;
      hdr.end._3_1_ = 0xce;
    }
    else {
      pcVar4 = len_prefix + 1;
      register0x00000008 =
           (ulong)pcVar9 >> 0x38 | ((ulong)pcVar9 & 0xff000000000000) >> 0x28 |
           ((ulong)pcVar9 & 0xff0000000000) >> 0x18 | ((ulong)pcVar9 & 0xff00000000) >> 8 |
           ((ulong)pcVar9 & 0xff000000) << 8 | ((ulong)pcVar9 & 0xff0000) << 0x18 |
           ((ulong)pcVar9 & 0xff00) << 0x28 | (long)pcVar9 << 0x38;
      hdr.end._3_1_ = 0xcf;
    }
    local_e8 = (undefined1  [8])((long)&hdr.end + 3);
    v[0].iov_base = pcVar4 + -(long)local_e8;
    uStack_f0 = 0x1166a0;
    sVar3 = (*s->writev)(s,(iovec *)local_e8,4);
  }
  return sVar3;
}

Assistant:

ssize_t
tnt_select(struct tnt_stream *s, uint32_t space, uint32_t index,
	   uint32_t limit, uint32_t offset, uint8_t iterator,
	   struct tnt_stream *key)
{
	if (tnt_object_verify(key, MP_ARRAY))
		return -1;
	struct tnt_iheader hdr;
	struct iovec v[4]; int v_sz = 4;
	char *data = NULL;
	encode_header(&hdr, TNT_OP_SELECT, s->reqid++);
	v[1].iov_base = (void *)hdr.header;
	v[1].iov_len  = hdr.end - hdr.header;
	char body[64]; data = body;

	data = mp_encode_map(data, 6);
	data = mp_encode_uint(data, TNT_SPACE);
	data = mp_encode_uint(data, space);
	data = mp_encode_uint(data, TNT_INDEX);
	data = mp_encode_uint(data, index);
	data = mp_encode_uint(data, TNT_LIMIT);
	data = mp_encode_uint(data, limit);
	data = mp_encode_uint(data, TNT_OFFSET);
	data = mp_encode_uint(data, offset);
	data = mp_encode_uint(data, TNT_ITERATOR);
	data = mp_encode_uint(data, iterator);
	data = mp_encode_uint(data, TNT_KEY);
	v[2].iov_base = body;
	v[2].iov_len  = data - body;
	v[3].iov_base = TNT_SBUF_DATA(key);
	v[3].iov_len  = TNT_SBUF_SIZE(key);

	size_t package_len = 0;
	for (int i = 1; i < v_sz; ++i)
		package_len += v[i].iov_len;
	char len_prefix[9];
	char *len_end = mp_encode_luint32(len_prefix, package_len);
	v[0].iov_base = len_prefix;
	v[0].iov_len = len_end - len_prefix;
	return s->writev(s, v, v_sz);
}